

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O2

lua_Integer lua_tointegerx(lua_State *L,int idx,int *isnum)

{
  TValue *obj;
  long lVar1;
  int iVar2;
  TValue n;
  
  obj = index2addr(L,idx);
  if ((obj->tt_ == 3) || (obj = luaV_tonumber(obj,&n), obj != (TValue *)0x0)) {
    lVar1 = (long)(obj->value_).n;
    if (isnum == (int *)0x0) {
      return lVar1;
    }
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    lVar1 = 0;
    if (isnum == (int *)0x0) {
      return 0;
    }
  }
  *isnum = iVar2;
  return lVar1;
}

Assistant:

LUA_API lua_Integer lua_tointegerx (lua_State *L, int idx, int *isnum) {
  TValue n;
  const TValue *o = index2addr(L, idx);
  if (tonumber(o, &n)) {
    lua_Integer res;
    lua_Number num = nvalue(o);
    lua_number2integer(res, num);
    if (isnum) *isnum = 1;
    return res;
  }
  else {
    if (isnum) *isnum = 0;
    return 0;
  }
}